

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistence.h
# Opt level: O0

void __thiscall
persistence_computer_t<directed_flag_complex_computer::directed_flag_complex_computer_t>::
compute_persistence(persistence_computer_t<directed_flag_complex_computer::directed_flag_complex_computer_t>
                    *this,unsigned_short min_dimension,unsigned_short max_dimension,
                   bool check_euler_characteristic)

{
  unsigned_long uVar1;
  ulong uVar2;
  unsigned_short uVar3;
  unsigned_short uVar4;
  unsigned_long uVar5;
  size_t sVar6;
  ostream *poVar7;
  void *this_00;
  unsigned_long *puVar8;
  byte in_CL;
  int iVar9;
  unsigned_short in_DX;
  ushort in_SI;
  undefined8 *in_RDI;
  size_t i_1;
  size_t i;
  index_t cell_euler_characteristic;
  bool computed_full_homology;
  unsigned_short in_stack_0000009c;
  unsigned_short in_stack_0000009e;
  persistence_computer_t<directed_flag_complex_computer::directed_flag_complex_computer_t>
  *in_stack_000000a0;
  unsigned_short in_stack_0000021c;
  unsigned_short in_stack_0000021e;
  persistence_computer_t<directed_flag_complex_computer::directed_flag_complex_computer_t>
  *in_stack_00000220;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  directed_flag_complex_computer_t *in_stack_ffffffffffffff80;
  directed_flag_complex_computer_t *this_01;
  bool local_41;
  unsigned_long local_38;
  size_t local_30;
  ulong local_28;
  ulong local_20;
  int local_14;
  bool local_e;
  byte local_d;
  unsigned_short local_c;
  ushort local_a;
  
  local_d = in_CL & 1;
  local_c = in_DX;
  local_a = in_SI;
  compute_zeroth_persistence(in_stack_00000220,in_stack_0000021e,in_stack_0000021c);
  compute_higher_persistence(in_stack_000000a0,in_stack_0000009e,in_stack_0000009c);
  directed_flag_complex_computer::directed_flag_complex_computer_t::finished
            ((directed_flag_complex_computer_t *)*in_RDI);
  (**(code **)(*(long *)in_RDI[1] + 0x20))((long *)in_RDI[1],local_d & 1);
  uVar3 = local_c;
  local_41 = false;
  if (local_a == 0) {
    uVar4 = std::numeric_limits<unsigned_short>::max();
    local_41 = uVar3 == uVar4;
  }
  local_e = local_41;
  if ((((local_d & 1) != 0) && (local_41 != false)) &&
     (uVar1 = in_RDI[3], uVar5 = std::numeric_limits<unsigned_long>::max(), uVar1 == uVar5)) {
    local_14 = 0;
    for (local_20 = 0; uVar2 = local_20,
        sVar6 = directed_flag_complex_computer::directed_flag_complex_computer_t::top_dimension
                          ((directed_flag_complex_computer_t *)0x1d3ed0), uVar2 <= sVar6;
        local_20 = local_20 + 1) {
      iVar9 = 1;
      if ((local_20 & 1) == 1) {
        iVar9 = -1;
      }
      sVar6 = directed_flag_complex_computer::directed_flag_complex_computer_t::number_of_cells
                        (in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
      local_14 = iVar9 * (int)sVar6 + local_14;
    }
    if ((*(byte *)((long)in_RDI + 0x24) & 1) != 0) {
      poVar7 = std::operator<<((ostream *)&std::cout,"The Euler characteristic is given by: ");
      this_00 = (void *)std::ostream::operator<<(poVar7,local_14);
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    }
    if (local_14 != *(int *)(in_RDI + 4)) {
      poVar7 = std::operator<<((ostream *)&std::cerr,
                               "ERROR: The homological Euler characteristic (which is ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,*(int *)(in_RDI + 4));
      poVar7 = std::operator<<(poVar7,") differs from the cellular Euler characteristic (which is ")
      ;
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_14);
      poVar7 = std::operator<<(poVar7,"), apparently there is an error in the program.");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    }
  }
  local_28 = (ulong)local_a;
  while( true ) {
    uVar2 = local_28;
    local_30 = directed_flag_complex_computer::directed_flag_complex_computer_t::top_dimension
                         ((directed_flag_complex_computer_t *)0x1d3ff7);
    local_38 = (ulong)local_c + 1;
    puVar8 = std::min<unsigned_long>(&local_30,&local_38);
    if (*puVar8 <= uVar2) break;
    this_01 = (directed_flag_complex_computer_t *)(in_RDI + 0x18);
    directed_flag_complex_computer::directed_flag_complex_computer_t::number_of_cells
              (this_01,in_stack_ffffffffffffff7c);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_01,
               (value_type_conflict3 *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)
              );
    local_28 = local_28 + 1;
  }
  return;
}

Assistant:

void compute_persistence(unsigned short min_dimension = 0,
	                         unsigned short max_dimension = std::numeric_limits<unsigned short>::max(),
	                         bool check_euler_characteristic = true) {
		compute_zeroth_persistence(min_dimension, max_dimension);
		compute_higher_persistence(min_dimension, max_dimension);
		complex.finished();
		output->finished(check_euler_characteristic);

		// Sanity check whether there were any problems computing the homology
		bool computed_full_homology = min_dimension == 0 && max_dimension == std::numeric_limits<unsigned short>::max();
		if (check_euler_characteristic && computed_full_homology && max_entries == std::numeric_limits<size_t>::max()) {
			index_t cell_euler_characteristic = 0;
			for (size_t i = 0; i <= complex.top_dimension(); i++) {
				cell_euler_characteristic += (i % 2 == 1 ? -1 : 1) * index_t(complex.number_of_cells(index_t(i)));
			}

			if (print_betti_numbers_to_console)
				std::cout << "The Euler characteristic is given by: " << cell_euler_characteristic << std::endl;

			if (cell_euler_characteristic != euler_characteristic) {
				std::cerr << "ERROR: The homological Euler characteristic (which is " << euler_characteristic
				          << ") differs from the cellular Euler characteristic (which is " << cell_euler_characteristic
				          << "), apparently there is an error in the program." << std::endl;
			}
		}

#ifdef RETRIEVE_PERSISTENCE
		for (size_t i = min_dimension; i < std::min(complex.top_dimension(), (size_t)max_dimension + 1); i++) {
			cell_count.push_back(index_t(complex.number_of_cells(index_t(i))));
		}
#endif
	}